

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O2

vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> * __thiscall
xmrig::OclConfig::get
          (vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>
           *__return_storage_ptr__,OclConfig *this,Miner *miner,OclPlatform *platform,
          vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *devices)

{
  pointer pOVar1;
  pointer pOVar2;
  long *plVar3;
  OclThreads *pOVar4;
  char *pcVar5;
  const_iterator __begin3;
  long *__args_5;
  OclThread *thread;
  pointer pOVar6;
  Miner *miner_local;
  pointer local_40;
  int64_t affinity;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  miner_local = miner;
  pOVar4 = Threads<xmrig::OclThreads>::get(&this->m_threads);
  pOVar6 = (pOVar4->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (pOVar4->m_data).super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar6 != pOVar1) {
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::reserve
              (__return_storage_ptr__,(((long)pOVar1 - (long)pOVar6) / 0x48) * 2);
    local_40 = (pOVar4->m_data).
               super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (pOVar6 = (pOVar4->m_data).
                  super__Vector_base<xmrig::OclThread,_std::allocator<xmrig::OclThread>_>._M_impl.
                  super__Vector_impl_data._M_start; pOVar6 != local_40; pOVar6 = pOVar6 + 1) {
      pOVar2 = (devices->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)pOVar6->m_index <
          (ulong)(((long)(devices->
                         super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pOVar2) / 0x68)) {
        __args_5 = (pOVar6->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        plVar3 = (pOVar6->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((ulong)((long)plVar3 - (long)__args_5) < 9) {
          std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
          emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long_const&>
                    ((vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>> *)
                     __return_storage_ptr__,&miner_local,this,platform,pOVar6,
                     pOVar2 + pOVar6->m_index,__args_5);
        }
        else {
          for (; __args_5 != plVar3; __args_5 = __args_5 + 1) {
            affinity = *__args_5;
            std::vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>>::
            emplace_back<xmrig::Miner_const*&,xmrig::OclConfig_const&,xmrig::OclPlatform_const&,xmrig::OclThread_const&,xmrig::OclDevice_const&,long&>
                      ((vector<xmrig::OclLaunchData,std::allocator<xmrig::OclLaunchData>> *)
                       __return_storage_ptr__,&miner_local,this,platform,pOVar6,
                       (devices->
                       super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
                       _M_impl.super__Vector_impl_data._M_start + pOVar6->m_index,&affinity);
          }
        }
      }
      else {
        pcVar5 = ocl_tag();
        Log::print(INFO,
                   "%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                   pcVar5,(ulong)pOVar6->m_index);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::OclLaunchData> xmrig::OclConfig::get(const Miner *miner, const OclPlatform &platform, const std::vector<OclDevice> &devices) const
{
    std::vector<OclLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count() * 2);

    for (const auto &thread : threads.data()) {
        if (thread.index() >= devices.size()) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), ocl_tag(), thread.index());
            continue;
        }

        if (thread.threads().size() > 1) {
            for (int64_t affinity : thread.threads()) {
                out.emplace_back(miner, *this, platform, thread, devices[thread.index()], affinity);
            }
        }
        else {
            out.emplace_back(miner, *this, platform, thread, devices[thread.index()], thread.threads().front());
        }
    }

    return out;
}